

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O2

char * Assimp::MappingTypeToString(aiTextureMapping in)

{
  if (in < (aiTextureMapping_PLANE|aiTextureMapping_CYLINDER)) {
    return &DAT_0058fda4 + *(int *)(&DAT_0058fda4 + (ulong)in * 4);
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/PostProcessing/ProcessHelper.cpp"
                ,0x126,"const char *Assimp::MappingTypeToString(aiTextureMapping)");
}

Assistant:

const char* MappingTypeToString(aiTextureMapping in)
{
    switch (in)
    {
    case aiTextureMapping_UV:
        return "UV";
    case aiTextureMapping_BOX:
        return "Box";
    case aiTextureMapping_SPHERE:
        return "Sphere";
    case aiTextureMapping_CYLINDER:
        return "Cylinder";
    case aiTextureMapping_PLANE:
        return "Plane";
    case aiTextureMapping_OTHER:
        return "Other";
    default:
        break;
    }

    ai_assert(false);
    return  "BUG";
}